

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionTypeParser.cpp
# Opt level: O2

TorsionType * __thiscall OpenMD::TorsionTypeParser::parseLine(TorsionTypeParser *this,string *line)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  RealType RVar4;
  RealType RVar5;
  RealType c3;
  uint uVar6;
  TorsionTypeEnum TVar7;
  _Rb_tree_header *p_Var8;
  PolynomialTorsionType *this_00;
  CharmmTorsionType *this_01;
  OpenMDException *pOVar9;
  int iVar10;
  uint uVar11;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  RealType RVar16;
  double dVar17;
  vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_> parameters
  ;
  RealType local_f8;
  RealType local_e8;
  _Base_ptr local_d8;
  CharmmTorsionParameter currParam;
  _Base_ptr local_a8;
  StringTokenizer tokenizer;
  ulong uVar12;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parameters," ;\t\n\r",(allocator<char> *)&currParam);
  StringTokenizer::StringTokenizer(&tokenizer,line,(string *)&parameters);
  std::__cxx11::string::~string((string *)&parameters);
  uVar6 = StringTokenizer::countTokens(&tokenizer);
  if ((int)uVar6 < 1) {
    pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parameters,"TorsionTypeParser: Not enough tokens",
               (allocator<char> *)&currParam);
    OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
    __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_((string *)&parameters,&tokenizer);
  TVar7 = getTorsionTypeEnum(this,(string *)&parameters);
  std::__cxx11::string::~string((string *)&parameters);
  if (ttHarmonic < TVar7) {
    pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parameters,"TorsionTypeParser: Unknown Torsion Type",
               (allocator<char> *)&currParam);
    OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
    __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  uVar11 = uVar6 - 1;
  switch(TVar7) {
  case ttGhostTorsion:
    if (uVar6 < 5) {
      pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"TorsionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
      __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_e8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_f8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_d8 = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_a8 = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&tokenizer);
    if (this->trans180_ == true) {
      this_01 = (CharmmTorsionType *)operator_new(0x28);
      goto LAB_001dd2d6;
    }
    this_01 = (CharmmTorsionType *)operator_new(0x28);
LAB_001dd43a:
    (((PolynomialTorsionType *)&this_01->super_TorsionType)->super_TorsionType)._vptr_TorsionType =
         (_func_int **)&PTR__TorsionType_0027b4f0;
    *(double *)&(this_01->T_).polyPairMap_._M_t._M_impl = -local_e8;
    *(RealType *)&(this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header = local_f8
    ;
    (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)((ulong)local_d8 ^ 0x8000000000000000);
    goto LAB_001dd47b;
  case ttCubic:
    if (uVar6 < 5) {
      pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"TorsionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
      __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_e8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_f8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_d8 = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_a8 = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&tokenizer);
    if (this->trans180_ != true) {
      this_01 = (CharmmTorsionType *)operator_new(0x28);
      goto LAB_001dd43a;
    }
    this_01 = (CharmmTorsionType *)operator_new(0x28);
LAB_001dd2d6:
    (((PolynomialTorsionType *)&this_01->super_TorsionType)->super_TorsionType)._vptr_TorsionType =
         (_func_int **)&PTR__TorsionType_0027b4f0;
    *(RealType *)&(this_01->T_).polyPairMap_._M_t._M_impl = local_e8;
    *(RealType *)&(this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header = local_f8
    ;
    (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_d8;
LAB_001dd47b:
    (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_a8;
    break;
  case ttQuartic:
    if (uVar6 < 6) {
      pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"TorsionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
      __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    RVar4 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    p_Var1 = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&tokenizer);
    p_Var2 = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&tokenizer);
    p_Var3 = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&tokenizer);
    if (this->trans180_ == true) {
      this_01 = (CharmmTorsionType *)operator_new(0x30);
      (((PolynomialTorsionType *)&this_01->super_TorsionType)->super_TorsionType)._vptr_TorsionType
           = (_func_int **)&PTR__TorsionType_0027b530;
      *(RealType *)&(this_01->T_).polyPairMap_._M_t._M_impl = RVar16;
      *(RealType *)&(this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header = RVar4;
      (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var1;
      (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
    }
    else {
      this_01 = (CharmmTorsionType *)operator_new(0x30);
      (((PolynomialTorsionType *)&this_01->super_TorsionType)->super_TorsionType)._vptr_TorsionType
           = (_func_int **)&PTR__TorsionType_0027b530;
      *(RealType *)&(this_01->T_).polyPairMap_._M_t._M_impl = RVar16;
      *(double *)&(this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header = -RVar4;
      (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var1;
      (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)((ulong)p_Var2 ^ 0x8000000000000000);
    }
    (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var3;
    break;
  case ttPolynomial:
    if ((uVar6 < 3) || ((uVar11 & 1) != 0)) {
      pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"TorsionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
      __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    this_01 = (CharmmTorsionType *)operator_new(0x38);
    uVar11 = uVar11 >> 1;
    (((PolynomialTorsionType *)&this_01->super_TorsionType)->super_TorsionType)._vptr_TorsionType =
         (_func_int **)&PTR__PolynomialTorsionType_0027b570;
    p_Var8 = &(this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header;
    (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var8->_M_header;
    (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var8->_M_header;
    (this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = (PolynomialTorsionType *)
              __dynamic_cast(this_01,&TorsionType::typeinfo,&PolynomialTorsionType::typeinfo,0);
    while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
      uVar6 = StringTokenizer::nextTokenAsInt(&tokenizer);
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      uVar14 = SUB84(RVar16,0);
      uVar15 = (undefined4)((ulong)RVar16 >> 0x20);
      if (this->trans180_ == false) {
        RVar16 = -RVar16;
      }
      if ((uVar6 & 1) != 0) {
        uVar14 = SUB84(RVar16,0);
        uVar15 = (undefined4)((ulong)RVar16 >> 0x20);
      }
      PolynomialTorsionType::setCoefficient(this_00,uVar6,(RealType)CONCAT44(uVar15,uVar14));
    }
    break;
  case ttCharmm:
    uVar12 = (ulong)uVar11 / 3;
    if ((uVar6 < 4) || (uVar11 % 3 != 0)) {
      pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"TorsionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
      __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    parameters.
    super__Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parameters.
    super__Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parameters.
    super__Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (iVar10 = (int)uVar12, uVar12 = (ulong)(iVar10 - 1), iVar10 != 0) {
      currParam.kchi = StringTokenizer::nextTokenAsDouble(&tokenizer);
      currParam.n = StringTokenizer::nextTokenAsInt(&tokenizer);
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      currParam.delta = (RVar16 / 180.0) * 3.141592653589793;
      if ((this->trans180_ == false) &&
         (currParam.delta = 3.141592653589793 - currParam.delta, (currParam.n & 1U) != 0)) {
        currParam.kchi = -currParam.kchi;
      }
      std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::
      push_back(&parameters,&currParam);
    }
    this_01 = (CharmmTorsionType *)operator_new(0x70);
    CharmmTorsionType::CharmmTorsionType(this_01,&parameters);
    std::
    _Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::
    ~_Vector_base(&parameters.
                   super__Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
                 );
    break;
  case ttOpls:
    if (uVar6 < 4) {
      pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"TorsionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
      __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    RVar4 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    RVar5 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_01 = (CharmmTorsionType *)operator_new(0x50);
    OplsTorsionType::OplsTorsionType((OplsTorsionType *)this_01,RVar16,RVar4,RVar5,this->trans180_);
    break;
  case ttTrappe:
    if (uVar6 < 5) {
      pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"TorsionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
      __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    RVar4 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    RVar5 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    c3 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_01 = (CharmmTorsionType *)operator_new(0x58);
    TrappeTorsionType::TrappeTorsionType
              ((TrappeTorsionType *)this_01,RVar16,RVar4,RVar5,c3,this->trans180_);
    break;
  case ttHarmonic:
    if (uVar6 < 3) {
      pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"TorsionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar9,(string *)&parameters);
      __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    RVar4 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    bVar13 = this->trans180_;
    this_01 = (CharmmTorsionType *)operator_new(0x18);
    dVar17 = RVar16 / 57.29577951308232;
    if (bVar13 == false) {
      dVar17 = 3.141592653589793 - dVar17;
    }
    (((PolynomialTorsionType *)&this_01->super_TorsionType)->super_TorsionType)._vptr_TorsionType =
         (_func_int **)&PTR__TorsionType_0027b618;
    *(double *)&(this_01->T_).polyPairMap_._M_t._M_impl = RVar4 * 3282.806350011744;
    *(double *)&(this_01->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header = dVar17;
  }
  StringTokenizer::~StringTokenizer(&tokenizer);
  return &this_01->super_TorsionType;
}

Assistant:

TorsionType* TorsionTypeParser::parseLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    TorsionType* torsionType = NULL;
    int nTokens              = tokenizer.countTokens();

    if (nTokens < 1) {
      throw OpenMDException("TorsionTypeParser: Not enough tokens");
    }

    TorsionTypeEnum tt = getTorsionTypeEnum(tokenizer.nextToken());

    nTokens -= 1;

    switch (tt) {
    case ttGhostTorsion:
      if (nTokens < 4) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        if (trans180_)
          torsionType = new CubicTorsionType(k3, k2, k1, k0);
        else
          torsionType = new CubicTorsionType(-k3, k2, -k1, k0);
      }
      break;

    case ttCubic:
      if (nTokens < 4) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        if (trans180_)
          torsionType = new CubicTorsionType(k3, k2, k1, k0);
        else
          torsionType = new CubicTorsionType(-k3, k2, -k1, k0);
      }
      break;

    case ttQuartic:
      if (nTokens < 5) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType k4 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        if (trans180_)
          torsionType = new QuarticTorsionType(k4, k3, k2, k1, k0);
        else
          torsionType = new QuarticTorsionType(k4, -k3, k2, -k1, k0);
      }
      break;

    case ttPolynomial:
      if (nTokens < 2 || nTokens % 2 != 0) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;
        torsionType = new PolynomialTorsionType();

        PolynomialTorsionType* ptt =
            dynamic_cast<PolynomialTorsionType*>(torsionType);

        for (int i = 0; i < nPairs; ++i) {
          power      = tokenizer.nextTokenAsInt();
          bool isOdd = power % 2 == 0 ? false : true;

          coefficient = tokenizer.nextTokenAsDouble();

          if (!trans180_ && isOdd) coefficient = -coefficient;

          ptt->setCoefficient(power, coefficient);
        }
      }

      break;

    case ttCharmm:

      if (nTokens < 3 || nTokens % 3 != 0) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        int nSets = nTokens / 3;

        std::vector<CharmmTorsionParameter> parameters;
        for (int i = 0; i < nSets; ++i) {
          CharmmTorsionParameter currParam;
          currParam.kchi  = tokenizer.nextTokenAsDouble();
          currParam.n     = tokenizer.nextTokenAsInt();
          currParam.delta = tokenizer.nextTokenAsDouble() / 180.0 *
                            Constants::PI;  // convert to rad

          bool isOdd = currParam.n % 2 == 0 ? false : true;
          if (!trans180_) {
            currParam.delta = Constants::PI - currParam.delta;
            if (isOdd) currParam.kchi = -currParam.kchi;
          }

          parameters.push_back(currParam);
        }

        torsionType = new CharmmTorsionType(parameters);
      }

      break;

    case ttOpls:

      if (nTokens < 3) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType v1 = tokenizer.nextTokenAsDouble();
        RealType v2 = tokenizer.nextTokenAsDouble();
        RealType v3 = tokenizer.nextTokenAsDouble();

        torsionType = new OplsTorsionType(v1, v2, v3, trans180_);
      }

      break;

    case ttTrappe:

      if (nTokens < 4) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType c0 = tokenizer.nextTokenAsDouble();
        RealType c1 = tokenizer.nextTokenAsDouble();
        RealType c2 = tokenizer.nextTokenAsDouble();
        RealType c3 = tokenizer.nextTokenAsDouble();
        torsionType = new TrappeTorsionType(c0, c1, c2, c3, trans180_);
      }

      break;

    case ttHarmonic:

      if (nTokens < 2) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        // Most torsions don't have specific angle information since
        // they are cosine polynomials.  This one is different,
        // however.  To match our other force field files
        // (particularly for bends):
        //
        // phi0 should be read in degrees
        // d0 should be read in kcal / mol / degrees^2

        RealType degreesPerRadian = 180.0 / Constants::PI;

        // convert to radians
        RealType phi0 = tokenizer.nextTokenAsDouble() / degreesPerRadian;

        // convert to kcal / mol / radians^2
        RealType d0 = tokenizer.nextTokenAsDouble() * pow(degreesPerRadian, 2);

        if (!trans180_) phi0 = Constants::PI - phi0;

        torsionType = new HarmonicTorsionType(d0, phi0);
      }

      break;

    case ttUnknown:
    default:
      throw OpenMDException("TorsionTypeParser: Unknown Torsion Type");
    }
    return torsionType;
  }